

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
llvm::SmallVector<unsigned_char,_4U>::SmallVector
          (SmallVector<unsigned_char,_4U> *this,SmallVector<unsigned_char,_4U> *RHS)

{
  bool bVar1;
  SmallVector<unsigned_char,_4U> *RHS_local;
  SmallVector<unsigned_char,_4U> *this_local;
  
  SmallVectorImpl<unsigned_char>::SmallVectorImpl(&this->super_SmallVectorImpl<unsigned_char>,4);
  bVar1 = SmallVectorBase::empty((SmallVectorBase *)RHS);
  if (!bVar1) {
    SmallVectorImpl<unsigned_char>::operator=
              (&this->super_SmallVectorImpl<unsigned_char>,
               &RHS->super_SmallVectorImpl<unsigned_char>);
  }
  return;
}

Assistant:

SmallVector(SmallVector &&RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(::std::move(RHS));
  }